

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Symbol>::moveAppend(QGenericArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  Symbol *pSVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  Token TVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<Symbol>).ptr;
    qVar6 = (this->super_QArrayDataPointer<Symbol>).size;
    do {
      TVar5 = b->token;
      pSVar1[qVar6].lineNum = b->lineNum;
      pSVar1[qVar6].token = TVar5;
      pDVar2 = (b->lex).d.d;
      (b->lex).d.d = (Data *)0x0;
      pSVar1[qVar6].lex.d.d = pDVar2;
      pcVar3 = (b->lex).d.ptr;
      (b->lex).d.ptr = (char *)0x0;
      pSVar1[qVar6].lex.d.ptr = pcVar3;
      qVar4 = (b->lex).d.size;
      (b->lex).d.size = 0;
      pSVar1[qVar6].lex.d.size = qVar4;
      qVar4 = b->len;
      pSVar1[qVar6].from = b->from;
      (&pSVar1[qVar6].from)[1] = qVar4;
      b = b + 1;
      qVar6 = (this->super_QArrayDataPointer<Symbol>).size + 1;
      (this->super_QArrayDataPointer<Symbol>).size = qVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }